

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O0

Keylet * jbcoin::keylet::payChan
                   (Keylet *__return_storage_ptr__,AccountID *source,AccountID *dst,uint32_t seq)

{
  result_type local_114;
  undefined1 local_f4 [8];
  sha512_half_hasher h;
  uint32_t seq_local;
  AccountID *dst_local;
  AccountID *source_local;
  
  h.h_.ctx_._208_4_ = seq;
  unique0x100000b4 = dst;
  jbcoin::detail::basic_sha512_half_hasher<false>::basic_sha512_half_hasher
            ((basic_sha512_half_hasher<false> *)local_f4);
  beast::hash_append<jbcoin::detail::basic_sha512_half_hasher<false>,unsigned_short>
            ((basic_sha512_half_hasher<false> *)local_f4,0x78);
  hash_append<jbcoin::detail::basic_sha512_half_hasher<false>,void>
            ((basic_sha512_half_hasher<false> *)local_f4,source);
  hash_append<jbcoin::detail::basic_sha512_half_hasher<false>,void>
            ((basic_sha512_half_hasher<false> *)local_f4,stack0xffffffffffffffe8);
  beast::hash_append<jbcoin::detail::basic_sha512_half_hasher<false>,unsigned_int>
            ((basic_sha512_half_hasher<false> *)local_f4,h.h_.ctx_._208_4_);
  jbcoin::detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (&local_114,(basic_sha512_half_hasher *)local_f4);
  Keylet::Keylet(__return_storage_ptr__,ltPAYCHAN,&local_114);
  jbcoin::detail::basic_sha512_half_hasher<false>::~basic_sha512_half_hasher
            ((basic_sha512_half_hasher<false> *)local_f4);
  return __return_storage_ptr__;
}

Assistant:

Keylet
payChan (AccountID const& source, AccountID const& dst, std::uint32_t seq)
{
    sha512_half_hasher h;
    using beast::hash_append;
    hash_append(h, std::uint16_t(spaceXRPUChannel));
    hash_append(h, source);
    hash_append(h, dst);
    hash_append(h, seq);
    return { ltPAYCHAN, static_cast<uint256>(h) };
}